

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::LongStressCaseInternal::DebugInfoRenderer::addTextToBuffer
          (DebugInfoRenderer *this,string *text,int yOffset)

{
  vector<float,_std::allocator<float>_> *this_00;
  iterator iVar1;
  iterator iVar2;
  int iVar3;
  ulong uVar4;
  undefined4 in_register_00000014;
  int x;
  uint uVar5;
  long lVar6;
  unsigned_short uVar7;
  long lVar8;
  uint uVar9;
  unsigned_short uVar10;
  unsigned_short uVar11;
  float bx;
  float ax;
  float by;
  float ay;
  unsigned_short local_8a;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_78;
  uint local_6c;
  ulong local_68;
  uint local_5c;
  long local_58;
  ulong local_50;
  string *local_48;
  long local_40;
  ulong local_38;
  
  local_68 = CONCAT44(in_register_00000014,yOffset);
  if ((addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&addTextToBuffer(std::__cxx11::string_const&,int)::
                                   charsStr_abi_cxx11_), iVar3 != 0)) {
    addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_._M_dataplus._M_p =
         (pointer)&addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_,
               "0123456789.:/","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&addTextToBuffer(std::__cxx11::string_const&,int)::charsStr_abi_cxx11_);
  }
  if (0 < (int)text->_M_string_length) {
    local_68 = (ulong)(uint)((int)local_68 << 3);
    this_00 = &this->m_posBuf;
    local_78 = &this->m_ndxBuf;
    local_38 = 0;
    lVar6 = 0;
    local_48 = text;
    do {
      lVar8 = local_38 + 1;
      iVar3 = std::__cxx11::string::find('x',(ulong)(uint)(int)(local_48->_M_dataplus)._M_p[lVar6]);
      uVar4 = (ulong)(uint)(iVar3 * 6);
      uVar9 = (int)lVar6 * 8;
      local_5c = 0;
      local_6c = uVar9;
      local_58 = lVar8;
      local_40 = lVar6;
      do {
        local_7c = (float)(int)(local_5c | (uint)local_68) * 0.1 * 0.125 + -1.0;
        local_80 = (float)(int)(local_5c + (uint)local_68 + 1) * 0.1 * 0.125 + -1.0;
        lVar6 = 0;
        local_5c = local_5c + 1;
        local_50 = uVar4;
        do {
          uVar5 = (uint)lVar6;
          local_84 = 1.0 - (float)(int)(uVar9 | uVar5) * 0.1 * 0.125;
          local_88 = 1.0 - (float)(int)((int)lVar8 + uVar5) * 0.1 * 0.125;
          if (" ####    #   #### #####    #  ###### ########### ####  ####         ##       ##    #  ##  #    #     #  #   #     #         # #    ##    #        ##      # #    #   #      #   ###  #  #  #### # ###    #   ####  #####               #  #    #   #     #       #######     ###   #  #   #    #     #        ##    #   #    #   #    #   #    #    # #    ##    # #    #    #   ##   ##    ##   #     ####   ### ###### ####     #  ####  #### #      #### ###     ##        #     "
              [(int)((int)uVar4 + uVar5)] != ' ') {
            uVar4 = (long)(this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_finish -
                    (long)(this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start;
            uVar10 = (unsigned_short)(((uint)(uVar4 >> 0x21) & 1) + (int)(uVar4 >> 2) >> 1);
            iVar1._M_current =
                 (this->m_ndxBuf).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar1._M_current ==
                (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_8a = uVar10;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>(local_78,iVar1,&local_8a);
            }
            else {
              *iVar1._M_current = uVar10;
              (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
            }
            uVar7 = uVar10 + 1;
            iVar1._M_current =
                 (this->m_ndxBuf).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar1._M_current ==
                (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_8a = uVar7;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>(local_78,iVar1,&local_8a);
            }
            else {
              *iVar1._M_current = uVar7;
              (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
            }
            uVar11 = uVar10 + 2;
            iVar1._M_current =
                 (this->m_ndxBuf).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar1._M_current ==
                (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_8a = uVar11;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>(local_78,iVar1,&local_8a);
            }
            else {
              *iVar1._M_current = uVar11;
              (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
            }
            iVar1._M_current =
                 (this->m_ndxBuf).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar1._M_current ==
                (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_8a = uVar11;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>(local_78,iVar1,&local_8a);
            }
            else {
              *iVar1._M_current = uVar11;
              (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
            }
            iVar1._M_current =
                 (this->m_ndxBuf).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar1._M_current ==
                (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_8a = uVar7;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>(local_78,iVar1,&local_8a);
            }
            else {
              *iVar1._M_current = uVar7;
              (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
            }
            lVar8 = local_58;
            local_8a = uVar10 + 3;
            iVar1._M_current =
                 (this->m_ndxBuf).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar1._M_current ==
                (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>(local_78,iVar1,&local_8a);
            }
            else {
              *iVar1._M_current = local_8a;
              (this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
            }
            iVar2._M_current =
                 (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)this_00,iVar2,&local_84);
            }
            else {
              *iVar2._M_current = local_84;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            iVar2._M_current =
                 (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)this_00,iVar2,&local_7c);
            }
            else {
              *iVar2._M_current = local_7c;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            iVar2._M_current =
                 (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)this_00,iVar2,&local_88);
            }
            else {
              *iVar2._M_current = local_88;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            iVar2._M_current =
                 (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)this_00,iVar2,&local_7c);
            }
            else {
              *iVar2._M_current = local_7c;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            iVar2._M_current =
                 (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)this_00,iVar2,&local_84);
            }
            else {
              *iVar2._M_current = local_84;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            iVar2._M_current =
                 (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)this_00,iVar2,&local_80);
            }
            else {
              *iVar2._M_current = local_80;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            iVar2._M_current =
                 (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)this_00,iVar2,&local_88);
            }
            else {
              *iVar2._M_current = local_88;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            iVar2._M_current =
                 (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)this_00,iVar2,&local_80);
              uVar4 = local_50;
              uVar9 = local_6c;
            }
            else {
              *iVar2._M_current = local_80;
              (this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
              uVar4 = local_50;
              uVar9 = local_6c;
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 6);
        uVar4 = uVar4 + 0x4e;
      } while (local_5c != 6);
      lVar6 = local_40 + 1;
      local_38 = (ulong)((int)local_38 + 8);
    } while (lVar6 < (int)local_48->_M_string_length);
  }
  return;
}

Assistant:

void DebugInfoRenderer::addTextToBuffer (const string& text, const int yOffset)
{
	static const char		characters[]	= "0123456789.:/";
	const int				numCharacters	= DE_LENGTH_OF_ARRAY(characters)-1; // \note -1 for null byte.
	const int				charWid			= 6;
	const int				charHei			= 6;
	static const string		charsStr		(characters);

	static const char font[numCharacters*charWid*charHei + 1]=
		" #### ""   #  "" #### ""##### ""   #  ""######"" #####""######"" #### "" #### ""      ""  ##  ""     #"
		"#    #""  ##  ""#    #""     #""  #   ""#     ""#     ""    # ""#    #""#    #""      ""  ##  ""    # "
		"#    #""   #  ""    # ""  ### "" #  # "" #### ""# ### ""   #  "" #### "" #####""      ""      ""   #  "
		"#    #""   #  ""   #  ""     #""######""     #""##   #""  #   ""#    #""     #""      ""  ##  ""  #   "
		"#    #""   #  ""  #   ""#    #""    # ""#    #""#    #"" #    ""#    #""   ## ""  ##  ""  ##  "" #    "
		" #### ""  ### ""######"" #### ""    # "" #### "" #### ""#     "" #### ""###   ""  ##  ""      ""#     ";

	for (int ndxInText = 0; ndxInText < (int)text.size(); ndxInText++)
	{
		const int ndxInCharset	= (int)charsStr.find(text[ndxInText]);
		DE_ASSERT(ndxInCharset < numCharacters);
		const int fontXStart	= ndxInCharset*charWid;

		for (int y = 0; y < charHei; y++)
		{
			float ay = -1.0f + (float)(y + 0 + yOffset*(charHei+2))*0.1f/(float)(charHei+2);
			float by = -1.0f + (float)(y + 1 + yOffset*(charHei+2))*0.1f/(float)(charHei+2);
			for (int x = 0; x < charWid; x++)
			{
				// \note Text is mirrored in x direction since on most(?) mobile devices the image is mirrored(?).
				float ax = 1.0f - (float)(x + 0 + ndxInText*(charWid+2))*0.1f/(float)(charWid+2);
				float bx = 1.0f - (float)(x + 1 + ndxInText*(charWid+2))*0.1f/(float)(charWid+2);

				if (font[y*numCharacters*charWid + fontXStart + x] != ' ')
				{
					const int vtxNdx = (int)m_posBuf.size()/2;

					m_ndxBuf.push_back(deUint16(vtxNdx+0));
					m_ndxBuf.push_back(deUint16(vtxNdx+1));
					m_ndxBuf.push_back(deUint16(vtxNdx+2));

					m_ndxBuf.push_back(deUint16(vtxNdx+2));
					m_ndxBuf.push_back(deUint16(vtxNdx+1));
					m_ndxBuf.push_back(deUint16(vtxNdx+3));

					m_posBuf.push_back(ax);
					m_posBuf.push_back(ay);

					m_posBuf.push_back(bx);
					m_posBuf.push_back(ay);

					m_posBuf.push_back(ax);
					m_posBuf.push_back(by);

					m_posBuf.push_back(bx);
					m_posBuf.push_back(by);
				}
			}
		}
	}
}